

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Assign<short,int,duckdb::ArgMinMaxState<short,int>>
               (ArgMinMaxState<short,_int> *state,short *x,int *y,bool x_null)

{
  int *in_RDX;
  short *in_RSI;
  long in_RDI;
  
  ArgMinMaxStateBase::AssignValue<short>((short *)(in_RDI + 2),*in_RSI);
  ArgMinMaxStateBase::AssignValue<int>((int *)(in_RDI + 4),*in_RDX);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}